

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::SIMDTernary::finalize(SIMDTernary *this)

{
  bool bVar1;
  bool local_41;
  Type local_30;
  BasicType local_24 [3];
  Type local_18;
  SIMDTernary *local_10;
  SIMDTernary *this_local;
  
  bVar1 = false;
  if ((this->a != (Expression *)0x0) && (bVar1 = false, this->b != (Expression *)0x0)) {
    bVar1 = this->c != (Expression *)0x0;
  }
  local_10 = this;
  if (bVar1) {
    wasm::Type::Type(&local_18,v128);
    (this->super_SpecificExpression<(wasm::Expression::Id)32>).super_Expression.type.id =
         local_18.id;
    local_24[2] = 1;
    bVar1 = wasm::Type::operator==(&this->a->type,local_24 + 2);
    local_41 = true;
    if (!bVar1) {
      local_24[1] = 1;
      bVar1 = wasm::Type::operator==(&this->b->type,local_24 + 1);
      local_41 = true;
      if (!bVar1) {
        local_24[0] = unreachable;
        local_41 = wasm::Type::operator==(&this->c->type,local_24);
      }
    }
    if (local_41 != false) {
      wasm::Type::Type(&local_30,unreachable);
      (this->super_SpecificExpression<(wasm::Expression::Id)32>).super_Expression.type.id =
           local_30.id;
    }
    return;
  }
  __assert_fail("a && b && c",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                ,0x1a2,"void wasm::SIMDTernary::finalize()");
}

Assistant:

void SIMDTernary::finalize() {
  assert(a && b && c);
  type = Type::v128;
  if (a->type == Type::unreachable || b->type == Type::unreachable ||
      c->type == Type::unreachable) {
    type = Type::unreachable;
  }
}